

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O2

void __thiscall CTcMake::write_build_config_to_sym_file(CTcMake *this,CVmFile *fp)

{
  CTcMakePath *pCVar1;
  char *__s;
  CTcMakeDef *pCVar2;
  size_t sVar3;
  CTcMakePath **ppCVar4;
  uint uVar5;
  textchar_t *ptVar6;
  CTcMakePath **ppCVar7;
  CTcMakeDef *pCVar8;
  CTcTokFileDesc *pCVar9;
  uint local_58;
  undefined1 local_54;
  
  local_58 = 0x30103;
  local_54 = 0;
  CVmFile::write_bytes(fp,(char *)&local_58,5);
  local_58 = CONCAT31(local_58._1_3_,(char)this->debug_);
  CVmFile::write_bytes(fp,(char *)&local_58,1);
  pCVar8 = (CTcMakeDef *)&this->def_head_;
  uVar5 = 0xffffffff;
  pCVar2 = pCVar8;
  do {
    pCVar2 = pCVar2->nxt_;
    uVar5 = uVar5 + 1;
  } while (pCVar2 != (CTcMakeDef *)0x0);
  CVmFile::write_uint2(fp,uVar5);
  while (pCVar8 = pCVar8->nxt_, pCVar8 != (CTcMakeDef *)0x0) {
    ptVar6 = (pCVar8->sym_).buf_;
    if (ptVar6 == (textchar_t *)0x0) {
      ptVar6 = "";
    }
    sVar3 = strlen(ptVar6);
    CVmFile::write_uint2(fp,(uint)sVar3);
    ptVar6 = (pCVar8->sym_).buf_;
    if (ptVar6 == (textchar_t *)0x0) {
      ptVar6 = "";
    }
    sVar3 = strlen(ptVar6);
    CVmFile::write_bytes(fp,ptVar6,sVar3);
    ptVar6 = (pCVar8->expan_).buf_;
    if (ptVar6 == (textchar_t *)0x0) {
      ptVar6 = "";
    }
    sVar3 = strlen(ptVar6);
    CVmFile::write_uint2(fp,(uint)sVar3);
    ptVar6 = (pCVar8->expan_).buf_;
    if (ptVar6 == (textchar_t *)0x0) {
      ptVar6 = "";
    }
    sVar3 = strlen(ptVar6);
    CVmFile::write_bytes(fp,ptVar6,sVar3);
    local_58 = CONCAT31(local_58._1_3_,pCVar8->field_0x18) & 0xffffff01;
    CVmFile::write_bytes(fp,(char *)&local_58,1);
  }
  uVar5 = 0;
  ppCVar7 = &this->inc_head_;
  for (ppCVar4 = ppCVar7; *ppCVar4 != (CTcMakePath *)0x0; ppCVar4 = &(*ppCVar4)->nxt_) {
    uVar5 = uVar5 + 1;
  }
  CVmFile::write_uint2(fp,uVar5);
  while (pCVar1 = *ppCVar7, pCVar1 != (CTcMakePath *)0x0) {
    ptVar6 = (pCVar1->path_).buf_;
    if (ptVar6 == (textchar_t *)0x0) {
      ptVar6 = "";
    }
    sVar3 = strlen(ptVar6);
    CVmFile::write_uint2(fp,(uint)sVar3);
    ptVar6 = (pCVar1->path_).buf_;
    if (ptVar6 == (textchar_t *)0x0) {
      ptVar6 = "";
    }
    sVar3 = strlen(ptVar6);
    CVmFile::write_bytes(fp,ptVar6,sVar3);
    ppCVar7 = &pCVar1->nxt_;
  }
  uVar5 = G_tok->next_filedesc_id_;
  if (G_tok->desc_head_ == (CTcTokFileDesc *)0x0) {
    pCVar9 = (CTcTokFileDesc *)0x0;
  }
  else {
    pCVar9 = G_tok->desc_head_->next_;
    uVar5 = uVar5 - 1;
  }
  CVmFile::write_uint2(fp,uVar5);
  for (; pCVar9 != (CTcTokFileDesc *)0x0; pCVar9 = pCVar9->next_) {
    sVar3 = strlen(pCVar9->fname_);
    CVmFile::write_uint2(fp,(uint)sVar3);
    __s = pCVar9->fname_;
    sVar3 = strlen(__s);
    CVmFile::write_bytes(fp,__s,sVar3);
  }
  return;
}

Assistant:

void CTcMake::write_build_config_to_sym_file(CVmFile *fp)
{
    CTcMakeDef *def;
    CTcMakePath *inc;
    CTcTokFileDesc *desc;
    size_t cnt;
    char buf[32];

    /* write the compiler version */
    buf[0] = TC_VSN_MAJOR;
    buf[1] = TC_VSN_MINOR;
    buf[2] = TC_VSN_REV;
    buf[3] = TC_VSN_PATCH;
    buf[4] = TC_VSN_DEVBUILD;
    fp->write_bytes(buf, 5);

    /* write the debug mode */
    buf[0] = (char)debug_;
    fp->write_bytes(buf, 1);

    /* 
     *   Write our list of pre-defined and pre-undefined symbols (-D and
     *   -U options).  If any changes are made to the -D/-U list, we'll
     *   have to rebuild, since these options can change the meaning of
     *   the source code.  
     */

    /* count the symbols in our list */
    for (cnt = 0, def = def_head_ ; def != 0 ;
         def = def->get_next(), ++cnt) ;

    /* write the count */
    fp->write_uint2(cnt);

    /* write each option */
    for (def = def_head_ ; def != 0 ; def = def->get_next())
    {
        /* write the symbol */
        fp->write_uint2(get_strlen(def->get_sym()));
        fp->write_bytes(def->get_sym(), get_strlen(def->get_sym()));

        /* write the expansion */
        if (def->get_expan() != 0)
        {
            fp->write_uint2(get_strlen(def->get_expan()));
            fp->write_bytes(def->get_expan(), get_strlen(def->get_expan()));
        }
        else
            fp->write_uint2(0);

        /* write the define/undefine flag */
        buf[0] = (char)def->is_def();
        fp->write_bytes(buf, 1);
    }
    
    /* 
     *   Write the #include search list.  If the search list changes, the
     *   location in which we find a particular header file could change,
     *   hence the text inserted by a #include directive could change,
     *   hence we'd have to rebuild.  
     */

    /* count the list */
    for (cnt = 0, inc = inc_head_ ; inc != 0 ;
         inc = inc->get_next(), ++cnt) ;

    /* write the count */
    fp->write_uint2(cnt);

    /* write the list */
    for (inc = inc_head_ ; inc != 0 ; inc = inc->get_next())
    {
        /* write the entry */
        fp->write_uint2(get_strlen(inc->get_path()));
        fp->write_bytes(inc->get_path(), get_strlen(inc->get_path()));
    }

    /*
     *   Write the actual list of #include files that were included in the
     *   program.  We'll have to check each of these to see if any of them
     *   have been modified more recently than the symbol file.
     */

    /* get the count */
    cnt = G_tok->get_filedesc_count();

    /* 
     *   start with the second descriptor, because the first is the source
     *   file itself, which isn't part of the include list 
     */
    desc = G_tok->get_first_filedesc();
    if (desc != 0)
    {
        /* skip the first descriptor */
        desc = desc->get_next();

        /* we're not writing it, so don't count it */
        --cnt;
    }

    /* write the count, excluding the actual source file */
    fp->write_uint2(cnt);

    /* write the descriptors */
    for ( ; desc != 0 ; desc = desc->get_next())
    {
        /* 
         *   Write the filename string.  Store the fully resolved local
         *   filename, not the original unresolved name, because we want to
         *   be able to detect a change in the configuration that points us
         *   to a different resolved local file.  
         */
        fp->write_uint2(get_strlen(desc->get_fname()));
        fp->write_bytes(desc->get_fname(), get_strlen(desc->get_fname()));
    }
}